

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGPUShader5SamplerArrayIndexing.cpp
# Opt level: O0

char * __thiscall
glcts::GPUShader5SamplerArrayIndexing::getVertexShaderCode(GPUShader5SamplerArrayIndexing *this)

{
  GPUShader5SamplerArrayIndexing *this_local;
  
  return getVertexShaderCode::result;
}

Assistant:

const char* GPUShader5SamplerArrayIndexing::getVertexShaderCode()
{
	static const char* result = "${VERSION}\n"
								"\n"
								"${GPU_SHADER5_REQUIRE}\n"
								"\n"
								"precision highp float;\n"
								"\n"
								"in vec4 position;"
								"\n"
								"void main()\n"
								"{\n"
								"   gl_Position = position;"
								"}\n";

	return result;
}